

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O3

bool slang::ast::isValidForIfaceVar(Type *type)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  long lVar5;
  bool bVar6;
  
  while( true ) {
    pTVar4 = type->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(type);
      pTVar4 = type->canonical;
    }
    pTVar3 = pTVar4->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(pTVar4);
      pTVar3 = pTVar4->canonical;
    }
    if ((pTVar3->super_Symbol).kind == VirtualInterfaceType) break;
    bVar2 = Type::isUnpackedArray(pTVar4);
    if (!bVar2) {
      pTVar3 = pTVar4->canonical;
      if (pTVar3 == (Type *)0x0) {
        Type::resolveCanonical(pTVar4);
        pTVar3 = pTVar4->canonical;
      }
      bVar2 = true;
      if (((pTVar3->super_Symbol).kind == UnpackedStructType) &&
         (pTVar3 = pTVar4[1].canonical, pTVar3 != (Type *)0x0)) {
        pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
        lVar5 = 0;
        do {
          pTVar4 = DeclaredType::getType
                             ((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar5) + 0x40));
          bVar2 = isValidForIfaceVar(pTVar4);
          if (!bVar2) {
            return bVar2;
          }
          bVar6 = (long)pTVar3 * 8 + -8 != lVar5;
          lVar5 = lVar5 + 8;
        } while (bVar6);
      }
      return bVar2;
    }
    type = Type::getArrayElementType(pTVar4);
  }
  return false;
}

Assistant:

static bool isValidForIfaceVar(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isVirtualInterface())
        return false;

    if (ct.isUnpackedArray())
        return isValidForIfaceVar(*ct.getArrayElementType());

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForIfaceVar(field->getType()))
                return false;
        }
    }

    return true;
}